

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::RandSeqProductionSymbol::serializeTo
          (RandSeqProductionSymbol *this,ASTSerializer *serializer)

{
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view propName;
  string_view propName_00;
  string_view propName_01;
  string_view propName_02;
  string_view propName_03;
  string_view propName_04;
  ASTSerializer *pAVar1;
  bool bVar2;
  Type *__n;
  reference ppFVar3;
  reference ppPVar4;
  anon_class_8_1_79d3bf50 *this_00;
  Expression *pEVar5;
  ASTSerializer *in_RSI;
  long in_RDI;
  RandSeqProductionSymbol *in_stack_000000a8;
  Expression *expr;
  iterator __end6;
  iterator __begin6;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range6;
  CaseItem *item;
  iterator __end5;
  iterator __begin5;
  span<const_slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL> *__range5;
  CaseProd *cp;
  RepeatProd *rp;
  IfElseProd *iep;
  ProdBase *prod;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const,_18446744073709551615UL> *__range3
  ;
  Rule *rule;
  iterator __end2_1;
  iterator __begin2_1;
  span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL> *__range2_1;
  FormalArgumentSymbol *arg;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *__range2;
  anon_class_8_1_79d3bf50 writeItem;
  ASTSerializer *in_stack_fffffffffffffcc8;
  ASTSerializer *in_stack_fffffffffffffcd0;
  ASTSerializer *in_stack_fffffffffffffcd8;
  ASTSerializer *in_stack_fffffffffffffce0;
  ASTSerializer *in_stack_fffffffffffffce8;
  ASTSerializer *in_stack_fffffffffffffcf0;
  ASTSerializer *in_stack_fffffffffffffd28;
  ASTSerializer *pAVar6;
  ASTSerializer *pAVar7;
  int local_2a0;
  void *local_298;
  int local_290;
  void *local_288;
  int local_280;
  void *local_278;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_250;
  reference local_248;
  reference local_230;
  CaseItem *local_228;
  __normal_iterator<const_slang::ast::RandSeqProductionSymbol::CaseItem_*,_std::span<const_slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL>_>
  local_220;
  ProdBase *local_218;
  undefined8 local_1f0;
  void *local_1e8;
  basic_string_view<char,_std::char_traits<char>_> local_1e0;
  undefined8 local_1d0;
  void *local_1c8;
  ProdBase *local_1c0;
  undefined8 local_1a8;
  void *local_1a0;
  basic_string_view<char,_std::char_traits<char>_> local_198;
  undefined8 local_188;
  void *local_180;
  ProdBase *local_178;
  undefined8 local_150;
  void *local_148;
  basic_string_view<char,_std::char_traits<char>_> local_140;
  undefined8 local_130;
  void *local_128;
  ProdBase *local_120;
  basic_string_view<char,_std::char_traits<char>_> local_118;
  undefined8 local_108;
  void *local_100;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  undefined8 local_d8;
  void *local_d0;
  ProdBase *local_c8;
  ProdBase **local_c0;
  __normal_iterator<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const_*,_std::span<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const,_18446744073709551615UL>_>
  local_b8;
  span<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const,_18446744073709551615UL> *local_b0
  ;
  reference local_98;
  Rule *local_90;
  __normal_iterator<const_slang::ast::RandSeqProductionSymbol::Rule_*,_std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
  local_88;
  span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL> local_80;
  span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL> *local_70;
  FormalArgumentSymbol *local_58;
  FormalArgumentSymbol **local_50;
  __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
  local_48;
  long local_40;
  int local_28;
  void *local_20;
  ASTSerializer *local_10;
  
  local_10 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffce0,
             (char *)in_stack_fffffffffffffcd8);
  __n = getReturnType((RandSeqProductionSymbol *)0x3eebc8);
  ASTSerializer::write(in_RSI,local_28,local_20,(size_t)__n);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffce0,
             (char *)in_stack_fffffffffffffcd8);
  name._M_str = (char *)in_stack_fffffffffffffcf0;
  name._M_len = (size_t)in_stack_fffffffffffffce8;
  ASTSerializer::startArray(in_stack_fffffffffffffce0,name);
  local_40 = in_RDI + 0xb8;
  local_48._M_current =
       (FormalArgumentSymbol **)
       std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)
                  in_stack_fffffffffffffcc8);
  local_50 = (FormalArgumentSymbol **)
             std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::end
                       ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>
                         *)in_stack_fffffffffffffcd8);
  while (bVar2 = __gnu_cxx::
                 operator==<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                           ((__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffcd0,
                            (__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffcc8), ((bVar2 ^ 0xffU) & 1) != 0) {
    ppFVar3 = __gnu_cxx::
              __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
              ::operator*(&local_48);
    local_58 = *ppFVar3;
    ASTSerializer::serialize(in_stack_fffffffffffffcd0,(Symbol *)in_stack_fffffffffffffcc8,false);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
    ::operator++(&local_48);
  }
  ASTSerializer::endArray((ASTSerializer *)0x3eecd1);
  pAVar7 = local_10;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffce0,
             (char *)in_stack_fffffffffffffcd8);
  name_00._M_str = (char *)in_stack_fffffffffffffcf0;
  name_00._M_len = (size_t)in_stack_fffffffffffffce8;
  ASTSerializer::startArray(in_stack_fffffffffffffce0,name_00);
  local_80 = getRules(in_stack_000000a8);
  local_70 = &local_80;
  local_88._M_current =
       (Rule *)std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>::
               begin((span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>
                      *)in_stack_fffffffffffffcc8);
  local_90 = (Rule *)std::
                     span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>::
                     end((span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>
                          *)in_stack_fffffffffffffcd8);
  while (bVar2 = __gnu_cxx::
                 operator==<const_slang::ast::RandSeqProductionSymbol::Rule_*,_std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
                           ((__normal_iterator<const_slang::ast::RandSeqProductionSymbol::Rule_*,_std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffcd0,
                            (__normal_iterator<const_slang::ast::RandSeqProductionSymbol::Rule_*,_std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffcc8), ((bVar2 ^ 0xffU) & 1) != 0) {
    local_98 = __gnu_cxx::
               __normal_iterator<const_slang::ast::RandSeqProductionSymbol::Rule_*,_std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
               ::operator*(&local_88);
    ASTSerializer::startObject((ASTSerializer *)0x3eeda5);
    pAVar6 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffce0,
               (char *)in_stack_fffffffffffffcd8);
    name_01._M_str = (char *)in_stack_fffffffffffffcf0;
    name_01._M_len = (size_t)in_stack_fffffffffffffce8;
    ASTSerializer::startArray(in_stack_fffffffffffffce0,name_01);
    local_b0 = &local_98->prods;
    local_b8._M_current =
         (ProdBase **)
         std::
         span<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const,_18446744073709551615UL>::
         begin((span<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const,_18446744073709551615UL>
                *)in_stack_fffffffffffffcc8);
    local_c0 = (ProdBase **)
               std::
               span<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const,_18446744073709551615UL>
               ::end((span<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const,_18446744073709551615UL>
                      *)in_stack_fffffffffffffcd8);
    while (bVar2 = __gnu_cxx::
                   operator==<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const_*,_std::span<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const_*,_std::span<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffffcd0,
                              (__normal_iterator<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const_*,_std::span<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffffcc8), ((bVar2 ^ 0xffU) & 1) != 0) {
      ppPVar4 = __gnu_cxx::
                __normal_iterator<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const_*,_std::span<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const,_18446744073709551615UL>_>
                ::operator*(&local_b8);
      local_c8 = *ppPVar4;
      ASTSerializer::startObject((ASTSerializer *)0x3eee63);
      pAVar1 = local_10;
      this_00 = (anon_class_8_1_79d3bf50 *)(ulong)local_c8->kind;
      switch(this_00) {
      case (anon_class_8_1_79d3bf50 *)0x0:
        in_stack_fffffffffffffd28 = local_10;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffce0,
                   (char *)in_stack_fffffffffffffcd8);
        local_e8 = sv((char *)in_stack_fffffffffffffcd0,(size_t)in_stack_fffffffffffffcc8);
        ASTSerializer::write(in_stack_fffffffffffffd28,(int)local_d8,local_d0,local_e8._M_len);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffce0,
                   (char *)in_stack_fffffffffffffcd8);
        propName._M_str = (char *)pAVar7;
        propName._M_len = (size_t)pAVar6;
        serializeTo::anon_class_8_1_79d3bf50::operator()
                  (this_00,propName,(ProdItem *)in_stack_fffffffffffffd28);
        break;
      case (anon_class_8_1_79d3bf50 *)0x1:
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffce0,
                   (char *)in_stack_fffffffffffffcd8);
        local_118 = sv((char *)in_stack_fffffffffffffcd0,(size_t)in_stack_fffffffffffffcc8);
        ASTSerializer::write(pAVar1,(int)local_108,local_100,local_118._M_len);
        break;
      case (anon_class_8_1_79d3bf50 *)0x2:
        local_120 = local_c8;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffce0,
                   (char *)in_stack_fffffffffffffcd8);
        local_140 = sv((char *)in_stack_fffffffffffffcd0,(size_t)in_stack_fffffffffffffcc8);
        ASTSerializer::write(pAVar1,(int)local_130,local_128,local_140._M_len);
        pAVar1 = local_10;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffce0,
                   (char *)in_stack_fffffffffffffcd8);
        pEVar5 = not_null<const_slang::ast::Expression_*>::operator*
                           ((not_null<const_slang::ast::Expression_*> *)0x3ef05a);
        ASTSerializer::write(pAVar1,(int)local_150,local_148,(size_t)pEVar5);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffce0,
                   (char *)in_stack_fffffffffffffcd8);
        propName_00._M_str = (char *)pAVar7;
        propName_00._M_len = (size_t)pAVar6;
        serializeTo::anon_class_8_1_79d3bf50::operator()
                  (this_00,propName_00,(ProdItem *)in_stack_fffffffffffffd28);
        bVar2 = std::optional::operator_cast_to_bool
                          ((optional<slang::ast::RandSeqProductionSymbol::ProdItem> *)0x3ef0c5);
        if (bVar2) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffce0,
                     (char *)in_stack_fffffffffffffcd8);
          std::optional<slang::ast::RandSeqProductionSymbol::ProdItem>::operator*
                    ((optional<slang::ast::RandSeqProductionSymbol::ProdItem> *)0x3ef0f0);
          propName_01._M_str = (char *)pAVar7;
          propName_01._M_len = (size_t)pAVar6;
          serializeTo::anon_class_8_1_79d3bf50::operator()
                    (this_00,propName_01,(ProdItem *)in_stack_fffffffffffffd28);
        }
        break;
      case (anon_class_8_1_79d3bf50 *)0x3:
        local_178 = local_c8;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffce0,
                   (char *)in_stack_fffffffffffffcd8);
        local_198 = sv((char *)in_stack_fffffffffffffcd0,(size_t)in_stack_fffffffffffffcc8);
        ASTSerializer::write(pAVar1,(int)local_188,local_180,local_198._M_len);
        pAVar1 = local_10;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffce0,
                   (char *)in_stack_fffffffffffffcd8);
        pEVar5 = not_null<const_slang::ast::Expression_*>::operator*
                           ((not_null<const_slang::ast::Expression_*> *)0x3ef1c3);
        ASTSerializer::write(pAVar1,(int)local_1a8,local_1a0,(size_t)pEVar5);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffce0,
                   (char *)in_stack_fffffffffffffcd8);
        propName_02._M_str = (char *)pAVar7;
        propName_02._M_len = (size_t)pAVar6;
        serializeTo::anon_class_8_1_79d3bf50::operator()
                  (this_00,propName_02,(ProdItem *)in_stack_fffffffffffffd28);
        break;
      case (anon_class_8_1_79d3bf50 *)0x4:
        local_1c0 = local_c8;
        in_stack_fffffffffffffcf0 = local_10;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffce0,
                   (char *)in_stack_fffffffffffffcd8);
        local_1e0 = sv((char *)in_stack_fffffffffffffcd0,(size_t)in_stack_fffffffffffffcc8);
        ASTSerializer::write(in_stack_fffffffffffffcf0,(int)local_1d0,local_1c8,local_1e0._M_len);
        pAVar1 = local_10;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffce0,
                   (char *)in_stack_fffffffffffffcd8);
        pEVar5 = not_null<const_slang::ast::Expression_*>::operator*
                           ((not_null<const_slang::ast::Expression_*> *)0x3ef2d0);
        ASTSerializer::write(pAVar1,(int)local_1f0,local_1e8,(size_t)pEVar5);
        bVar2 = std::optional::operator_cast_to_bool
                          ((optional<slang::ast::RandSeqProductionSymbol::ProdItem> *)0x3ef2fe);
        if (bVar2) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffce0,
                     (char *)in_stack_fffffffffffffcd8);
          std::optional<slang::ast::RandSeqProductionSymbol::ProdItem>::operator*
                    ((optional<slang::ast::RandSeqProductionSymbol::ProdItem> *)0x3ef329);
          propName_03._M_str = (char *)pAVar7;
          propName_03._M_len = (size_t)pAVar6;
          serializeTo::anon_class_8_1_79d3bf50::operator()
                    (this_00,propName_03,(ProdItem *)in_stack_fffffffffffffd28);
        }
        in_stack_fffffffffffffce8 = local_10;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffce0,
                   (char *)in_stack_fffffffffffffcd8);
        name_02._M_str = (char *)in_stack_fffffffffffffcf0;
        name_02._M_len = (size_t)in_stack_fffffffffffffce8;
        ASTSerializer::startArray(in_stack_fffffffffffffce0,name_02);
        local_218 = local_1c0 + 4;
        local_220._M_current =
             (CaseItem *)
             std::span<const_slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL>
             ::begin((span<const_slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL>
                      *)in_stack_fffffffffffffcc8);
        local_228 = (CaseItem *)
                    std::
                    span<const_slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL>
                    ::end((span<const_slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL>
                           *)in_stack_fffffffffffffcd8);
        while (bVar2 = __gnu_cxx::
                       operator==<const_slang::ast::RandSeqProductionSymbol::CaseItem_*,_std::span<const_slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL>_>
                                 ((__normal_iterator<const_slang::ast::RandSeqProductionSymbol::CaseItem_*,_std::span<const_slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL>_>
                                   *)in_stack_fffffffffffffcd0,
                                  (__normal_iterator<const_slang::ast::RandSeqProductionSymbol::CaseItem_*,_std::span<const_slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL>_>
                                   *)in_stack_fffffffffffffcc8), ((bVar2 ^ 0xffU) & 1) != 0) {
          local_230 = __gnu_cxx::
                      __normal_iterator<const_slang::ast::RandSeqProductionSymbol::CaseItem_*,_std::span<const_slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL>_>
                      ::operator*(&local_220);
          ASTSerializer::startObject((ASTSerializer *)0x3ef404);
          in_stack_fffffffffffffce0 = local_10;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_10,
                     (char *)in_stack_fffffffffffffcd8);
          name_03._M_str = (char *)in_stack_fffffffffffffcf0;
          name_03._M_len = (size_t)in_stack_fffffffffffffce8;
          ASTSerializer::startArray(in_stack_fffffffffffffce0,name_03);
          local_248 = local_230;
          local_250._M_current =
               (Expression **)
               std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                         ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                          in_stack_fffffffffffffcc8);
          std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                    ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                     in_stack_fffffffffffffcd8);
          while (bVar2 = __gnu_cxx::
                         operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                                   ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                                     *)in_stack_fffffffffffffcd0,
                                    (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                                     *)in_stack_fffffffffffffcc8), ((bVar2 ^ 0xffU) & 1) != 0) {
            __gnu_cxx::
            __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
            ::operator*(&local_250);
            ASTSerializer::serialize
                      (in_stack_fffffffffffffcd0,(Expression *)in_stack_fffffffffffffcc8);
            __gnu_cxx::
            __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
            ::operator++(&local_250);
          }
          ASTSerializer::endArray((ASTSerializer *)0x3ef4df);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffce0,
                     (char *)in_stack_fffffffffffffcd8);
          propName_04._M_str = (char *)pAVar7;
          propName_04._M_len = (size_t)pAVar6;
          serializeTo::anon_class_8_1_79d3bf50::operator()
                    (this_00,propName_04,(ProdItem *)in_stack_fffffffffffffd28);
          ASTSerializer::endObject((ASTSerializer *)0x3ef529);
          __gnu_cxx::
          __normal_iterator<const_slang::ast::RandSeqProductionSymbol::CaseItem_*,_std::span<const_slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL>_>
          ::operator++(&local_220);
        }
        ASTSerializer::endArray((ASTSerializer *)0x3ef548);
      }
      ASTSerializer::endObject((ASTSerializer *)0x3ef555);
      __gnu_cxx::
      __normal_iterator<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const_*,_std::span<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const,_18446744073709551615UL>_>
      ::operator++(&local_b8);
    }
    ASTSerializer::endArray((ASTSerializer *)0x3ef574);
    if (local_98->weightExpr != (Expression *)0x0) {
      in_stack_fffffffffffffcd8 = local_10;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffce0,
                 (char *)local_10);
      ASTSerializer::write
                (in_stack_fffffffffffffcd8,local_280,local_278,(size_t)local_98->weightExpr);
    }
    in_stack_fffffffffffffcd0 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffce0,
               (char *)in_stack_fffffffffffffcd8);
    ASTSerializer::write
              (in_stack_fffffffffffffcd0,local_290,local_288,(ulong)(local_98->isRandJoin & 1));
    if (local_98->randJoinExpr != (Expression *)0x0) {
      in_stack_fffffffffffffcc8 = local_10;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffce0,
                 (char *)in_stack_fffffffffffffcd8);
      ASTSerializer::write
                (in_stack_fffffffffffffcc8,local_2a0,local_298,(size_t)local_98->randJoinExpr);
    }
    ASTSerializer::endObject((ASTSerializer *)0x3ef676);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::RandSeqProductionSymbol::Rule_*,_std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
    ::operator++(&local_88);
  }
  ASTSerializer::endArray((ASTSerializer *)0x3ef695);
  return;
}

Assistant:

void RandSeqProductionSymbol::serializeTo(ASTSerializer& serializer) const {
    auto writeItem = [&](std::string_view propName, const ProdItem& item) {
        serializer.writeProperty(propName);
        serializer.startObject();
        if (item.target)
            serializer.writeLink("target", *item.target);

        serializer.startArray("args");
        for (auto arg : item.args)
            serializer.serialize(*arg);
        serializer.endArray();

        serializer.endObject();
    };

    serializer.write("returnType", getReturnType());

    serializer.startArray("arguments");
    for (auto arg : arguments)
        serializer.serialize(*arg);
    serializer.endArray();

    serializer.startArray("rules");
    for (auto& rule : getRules()) {
        serializer.startObject();

        serializer.startArray("prods");
        for (auto prod : rule.prods) {
            serializer.startObject();
            switch (prod->kind) {
                case ProdKind::Item:
                    serializer.write("kind", "Item"sv);
                    writeItem("item", *(const ProdItem*)prod);
                    break;
                case ProdKind::CodeBlock:
                    serializer.write("kind", "CodeBlock"sv);
                    break;
                case ProdKind::IfElse: {
                    auto& iep = *(const IfElseProd*)prod;
                    serializer.write("kind", "IfElse"sv);
                    serializer.write("expr", *iep.expr);

                    writeItem("ifItem", iep.ifItem);
                    if (iep.elseItem)
                        writeItem("elseItem", *iep.elseItem);
                    break;
                }
                case ProdKind::Repeat: {
                    auto& rp = *(const RepeatProd*)prod;
                    serializer.write("kind", "Repeat"sv);
                    serializer.write("expr", *rp.expr);
                    writeItem("item", rp.item);
                    break;
                }
                case ProdKind::Case: {
                    auto& cp = *(const CaseProd*)prod;
                    serializer.write("kind", "Case"sv);
                    serializer.write("expr", *cp.expr);
                    if (cp.defaultItem)
                        writeItem("defaultItem", *cp.defaultItem);

                    serializer.startArray("items");
                    for (auto& item : cp.items) {
                        serializer.startObject();
                        serializer.startArray("expressions");
                        for (auto expr : item.expressions)
                            serializer.serialize(*expr);
                        serializer.endArray();

                        writeItem("item", item.item);
                        serializer.endObject();
                    }
                    serializer.endArray();
                    break;
                }
            }
            serializer.endObject();
        }
        serializer.endArray();

        if (rule.weightExpr)
            serializer.write("weightExpr", *rule.weightExpr);

        serializer.write("isRandJoin", rule.isRandJoin);
        if (rule.randJoinExpr)
            serializer.write("randJoinExpr", *rule.randJoinExpr);

        serializer.endObject();
    }
    serializer.endArray();
}